

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables.c
# Opt level: O3

void print_chain(ip_chain_t *ipc)

{
  list_head *plVar1;
  char *pcVar2;
  
  printf("\tChain [%s]",ipc);
  if (ipc->policy == 6) {
    putchar(10);
  }
  else {
    pcVar2 = map_int_get_k(ipc->policy,m_target);
    printf(" (policy %s)\n",pcVar2);
  }
  for (plVar1 = (ipc->rules).next; plVar1 != &ipc->rules; plVar1 = plVar1->next) {
    printf("\t\t");
    print_rule((ip_rule_t *)(plVar1 + -5));
  }
  putchar(10);
  return;
}

Assistant:

static void print_chain(ip_chain_t *ipc)
{
	printf("\tChain [%s]", ipc->name);

	if (ipc->policy != TARGET_NONE) {
		printf(" (policy %s)\n", map_int_get_k(ipc->policy, m_target));
	} else {
		printf("\n");
	}

	ip_rule_t *p = NULL;
	list_for_each_entry(p, &ipc->rules, list) {
		printf("\t\t");
		print_rule(p);
	}
	printf("\n");
}